

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O0

char * eventClassName(Type t)

{
  Type t_local;
  char *local_8;
  
  switch(t) {
  case Timer:
    local_8 = "QTimerEvent";
    break;
  case MouseButtonPress:
  case MouseButtonRelease:
  case MouseButtonDblClick:
  case MouseMove:
  case NonClientAreaMouseMove:
  case NonClientAreaMouseButtonPress:
  case NonClientAreaMouseButtonRelease:
  case NonClientAreaMouseButtonDblClick:
    local_8 = "QMouseEvent";
    break;
  case KeyPress:
  case KeyRelease:
  case ShortcutOverride:
    local_8 = "QKeyEvent";
    break;
  case FocusIn:
  case FocusOut:
  case FocusAboutToChange:
    local_8 = "QFocusEvent";
    break;
  case Enter:
    local_8 = "QEnterEvent";
    break;
  default:
    local_8 = "QEvent";
    break;
  case Paint:
    local_8 = "QPaintEvent";
    break;
  case Move:
    local_8 = "QMoveEvent";
    break;
  case Resize:
    local_8 = "QResizeEvent";
    break;
  case Show:
    local_8 = "QShowEvent";
    break;
  case Hide:
    local_8 = "QHideEvent";
    break;
  case Close:
    local_8 = "QCloseEvent";
    break;
  case Wheel:
    local_8 = "QWheelEvent";
    break;
  case DragEnter:
    local_8 = "QDragEnterEvent";
    break;
  case DragMove:
    local_8 = "QDragMoveEvent";
    break;
  case Drop:
    local_8 = "QDropEvent";
    break;
  case ChildAdded:
  case ChildPolished:
  case ChildRemoved:
    local_8 = "QChildEvent";
    break;
  case InputMethod:
    local_8 = "QInputMethodEvent";
    break;
  case TabletMove:
  case TabletPress:
  case TabletRelease:
  case TabletEnterProximity:
  case TabletLeaveProximity:
    local_8 = "QTabletEvent";
    break;
  case WindowStateChange:
    local_8 = "QWindowStateChangeEvent";
    break;
  case ToolTip:
    local_8 = "QHelpEvent";
    break;
  case StatusTip:
    local_8 = "QStatusTipEvent";
    break;
  case ActionChanged:
  case ActionAdded:
  case ActionRemoved:
    local_8 = "QActionEvent";
    break;
  case FileOpen:
    local_8 = "QFileOpenEvent";
    break;
  case Shortcut:
    local_8 = "QShortcutEvent";
    break;
  case HoverEnter:
  case HoverLeave:
  case HoverMove:
    local_8 = "QHoverEvent";
    break;
  case GraphicsSceneMouseMove:
  case GraphicsSceneMousePress:
  case GraphicsSceneMouseRelease:
  case GraphicsSceneMouseDoubleClick:
    local_8 = "QGraphicsSceneMouseEvent";
    break;
  case GraphicsSceneContextMenu:
  case GraphicsSceneHoverEnter:
  case GraphicsSceneHoverMove:
  case GraphicsSceneHoverLeave:
  case GraphicsSceneHelp:
  case GraphicsSceneDragEnter:
  case GraphicsSceneDragMove:
  case GraphicsSceneDragLeave:
  case GraphicsSceneDrop:
  case GraphicsSceneWheel:
    local_8 = "QGraphicsSceneEvent";
    break;
  case TouchBegin:
  case TouchUpdate:
  case TouchEnd:
    local_8 = "QTouchEvent";
    break;
  case NativeGesture:
    local_8 = "QNativeGestureEvent";
    break;
  case Gesture:
  case GestureOverride:
    local_8 = "QGestureEvent";
    break;
  case ScrollPrepare:
    local_8 = "QScrollPrepareEvent";
    break;
  case Scroll:
    local_8 = "QScrollEvent";
    break;
  case InputMethodQuery:
    local_8 = "QInputMethodQueryEvent";
    break;
  case OrientationChange:
    local_8 = "QScreenOrientationChangeEvent";
    break;
  case PlatformSurface:
    local_8 = "QPlatformSurfaceEvent";
  }
  return local_8;
}

Assistant:

static const char *eventClassName(QEvent::Type t)
{
    switch (t) {
    case QEvent::ActionAdded:
    case QEvent::ActionRemoved:
    case QEvent::ActionChanged:
        return "QActionEvent";
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseButtonDblClick:
    case QEvent::MouseMove:
    case QEvent::NonClientAreaMouseMove:
    case QEvent::NonClientAreaMouseButtonPress:
    case QEvent::NonClientAreaMouseButtonRelease:
    case QEvent::NonClientAreaMouseButtonDblClick:
        return "QMouseEvent";
    case QEvent::DragEnter:
        return "QDragEnterEvent";
    case QEvent::DragMove:
        return "QDragMoveEvent";
    case QEvent::Drop:
        return "QDropEvent";
    case QEvent::KeyPress:
    case QEvent::KeyRelease:
    case QEvent::ShortcutOverride:
        return "QKeyEvent";
    case QEvent::FocusIn:
    case QEvent::FocusOut:
    case QEvent::FocusAboutToChange:
        return "QFocusEvent";
    case QEvent::ChildAdded:
    case QEvent::ChildPolished:
    case QEvent::ChildRemoved:
        return "QChildEvent";
    case QEvent::Paint:
        return "QPaintEvent";
    case QEvent::Move:
        return "QMoveEvent";
    case QEvent::Resize:
        return "QResizeEvent";
    case QEvent::Show:
        return "QShowEvent";
    case QEvent::Hide:
        return "QHideEvent";
    case QEvent::Enter:
        return "QEnterEvent";
    case QEvent::Close:
        return "QCloseEvent";
    case QEvent::FileOpen:
        return "QFileOpenEvent";
#ifndef QT_NO_GESTURES
    case QEvent::NativeGesture:
        return "QNativeGestureEvent";
    case QEvent::Gesture:
    case QEvent::GestureOverride:
        return "QGestureEvent";
#endif
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        return "QHoverEvent";
    case QEvent::TabletEnterProximity:
    case QEvent::TabletLeaveProximity:
    case QEvent::TabletPress:
    case QEvent::TabletMove:
    case QEvent::TabletRelease:
        return "QTabletEvent";
    case QEvent::StatusTip:
        return "QStatusTipEvent";
    case QEvent::ToolTip:
        return "QHelpEvent";
    case QEvent::WindowStateChange:
        return "QWindowStateChangeEvent";
    case QEvent::Wheel:
        return "QWheelEvent";
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
        return "QTouchEvent";
    case QEvent::Shortcut:
        return "QShortcutEvent";
    case QEvent::InputMethod:
        return "QInputMethodEvent";
    case QEvent::InputMethodQuery:
        return "QInputMethodQueryEvent";
    case QEvent::OrientationChange:
        return "QScreenOrientationChangeEvent";
    case QEvent::ScrollPrepare:
        return "QScrollPrepareEvent";
    case QEvent::Scroll:
        return "QScrollEvent";
    case QEvent::GraphicsSceneMouseMove:
    case QEvent::GraphicsSceneMousePress:
    case QEvent::GraphicsSceneMouseRelease:
    case QEvent::GraphicsSceneMouseDoubleClick:
        return "QGraphicsSceneMouseEvent";
    case QEvent::GraphicsSceneContextMenu:
    case QEvent::GraphicsSceneHoverEnter:
    case QEvent::GraphicsSceneHoverMove:
    case QEvent::GraphicsSceneHoverLeave:
    case QEvent::GraphicsSceneHelp:
    case QEvent::GraphicsSceneDragEnter:
    case QEvent::GraphicsSceneDragMove:
    case QEvent::GraphicsSceneDragLeave:
    case QEvent::GraphicsSceneDrop:
    case QEvent::GraphicsSceneWheel:
        return "QGraphicsSceneEvent";
    case QEvent::Timer:
        return "QTimerEvent";
    case QEvent::PlatformSurface:
        return "QPlatformSurfaceEvent";
    default:
        break;
    }
    return "QEvent";
}